

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O2

void CB_EXPLORE::predict_or_learn_first<false>(cb_explore *data,single_learner *base,example *ec)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t i_1;
  uint32_t i;
  uint uVar3;
  action_scores probs;
  action_score local_64;
  float local_5c;
  v_array<ACTION_SCORE::action_score> local_58;
  
  local_58._begin = (ec->pred).a_s._begin;
  local_58._end = (action_score *)(ec->pred).scalars._end;
  local_58.end_array = (action_score *)(ec->pred).scalars.end_array;
  local_58.erase_count = (ec->pred).scalars.erase_count;
  uVar3 = 0;
  LEARNER::learner<char,_example>::predict(base,ec,0);
  v_array<ACTION_SCORE::action_score>::clear(&local_58);
  if (data->tau == 0) {
    uVar1 = (ec->pred).multiclass;
    for (uVar3 = 0; uVar3 < (data->cbcs).num_actions; uVar3 = uVar3 + 1) {
      local_64.score = 0.0;
      local_64.action = uVar3;
      v_array<ACTION_SCORE::action_score>::push_back(&local_58,&local_64);
    }
    local_58._begin[uVar1 - 1].score = 1.0;
  }
  else {
    uVar2 = (data->cbcs).num_actions;
    local_5c = 1.0 / (float)uVar2;
    for (; uVar3 < uVar2; uVar3 = uVar3 + 1) {
      local_64.score = local_5c;
      local_64.action = uVar3;
      v_array<ACTION_SCORE::action_score>::push_back(&local_58,&local_64);
      uVar2 = (data->cbcs).num_actions;
    }
    data->tau = data->tau - 1;
  }
  (ec->pred).scalars.end_array = (float *)local_58.end_array;
  (ec->pred).scalars.erase_count = local_58.erase_count;
  (ec->pred).a_s._begin = local_58._begin;
  (ec->pred).scalars._end = (float *)local_58._end;
  return;
}

Assistant:

void predict_or_learn_first(cb_explore& data, single_learner& base, example& ec)
{
  // Explore tau times, then act according to optimal.
  action_scores probs = ec.pred.a_s;

  if (is_learn && ec.l.cb.costs[0].probability < 1)
    base.learn(ec);
  else
    base.predict(ec);

  probs.clear();
  if (data.tau > 0)
  {
    float prob = 1.f / (float)data.cbcs.num_actions;
    for (uint32_t i = 0; i < data.cbcs.num_actions; i++) probs.push_back({i, prob});
    data.tau--;
  }
  else
  {
    uint32_t chosen = ec.pred.multiclass - 1;
    for (uint32_t i = 0; i < data.cbcs.num_actions; i++) probs.push_back({i, 0.});
    probs[chosen].score = 1.0;
  }

  ec.pred.a_s = probs;
}